

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O3

int greatest_memory_equal_cb(void *expd,void *got,void *udata)

{
  int iVar1;
  
  iVar1 = bcmp(expd,got,*(size_t *)((long)udata + 0x10));
  return (int)(iVar1 == 0);
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}